

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O0

FT_Byte ft_gray_for_premultiplied_srgb_bgra(FT_Byte *bgra)

{
  byte bVar1;
  FT_UInt l;
  FT_UInt a;
  FT_Byte *bgra_local;
  
  bVar1 = bgra[3];
  if (bVar1 == 0) {
    bgra_local._7_1_ = '\0';
  }
  else {
    bgra_local._7_1_ =
         bVar1 - (char)((uint)((ulong)*bgra * 0x127c * (ulong)*bgra +
                               (ulong)bgra[1] * 0xb717 * (ulong)bgra[1] +
                               (ulong)bgra[2] * 0x366d * (ulong)bgra[2] >> 0x10) / (uint)bVar1);
  }
  return bgra_local._7_1_;
}

Assistant:

static FT_Byte
  ft_gray_for_premultiplied_srgb_bgra( const FT_Byte*  bgra )
  {
    FT_UInt  a = bgra[3];
    FT_UInt  l;


    /* Short-circuit transparent color to avoid division by zero. */
    if ( !a )
      return 0;

    /*
     * Luminosity for sRGB is defined using ~0.2126,0.7152,0.0722
     * coefficients for RGB channels *on the linear colors*.
     * A gamma of 2.2 is fair to assume.  And then, we need to
     * undo the premultiplication too.
     *
     *   https://accessibility.kde.org/hsl-adjusted.php
     *
     * We do the computation with integers only, applying a gamma of 2.0.
     * We guarantee 32-bit arithmetic to avoid overflow but the resulting
     * luminosity fits into 16 bits.
     *
     */

    l = (  4732UL /* 0.0722 * 65536 */ * bgra[0] * bgra[0] +
          46871UL /* 0.7152 * 65536 */ * bgra[1] * bgra[1] +
          13933UL /* 0.2126 * 65536 */ * bgra[2] * bgra[2] ) >> 16;

    /*
     * Final transparency can be determined as follows.
     *
     * - If alpha is zero, we want 0.
     * - If alpha is zero and luminosity is zero, we want 255.
     * - If alpha is zero and luminosity is one, we want 0.
     *
     * So the formula is a * (1 - l) = a - l * a.
     *
     * We still need to undo premultiplication by dividing l by a*a.
     *
     */

    return (FT_Byte)( a - l / a );
  }